

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio-lite.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* getFilesList(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *__return_storage_ptr__,string *cpioArchivePath)

{
  bool bVar1;
  ssize_t sVar2;
  size_t sVar3;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> __s;
  CpioException *this;
  ulong __n;
  DescriptorWrapper fd;
  allocator<char> local_81;
  __array cFilename;
  string filename;
  header_old_cpio header;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DescriptorWrapper::openFile(&fd,cpioArchivePath,0);
  while( true ) {
    sVar2 = DescriptorWrapper::readTo(&fd,&header,0x1a);
    if (sVar2 == 0) {
      this = (CpioException *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filename,"Unexpected EOF",(allocator<char> *)&cFilename);
      CpioException::CpioException(this,InvalidInputArchive,&filename);
      __cxa_throw(this,&CpioException::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = isHeaderLittleEndian(&header);
    if (bVar1) {
      switchEndianness(&header);
    }
    sVar3 = getFilenameSizeFromBigEndianHeader(&header);
    __n = ((uint)sVar3 & 1) + sVar3;
    __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(__n);
    memset((void *)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
    cFilename._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    DescriptorWrapper::readTo
              (&fd,(void *)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,
               (char *)cFilename._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                       .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl,&local_81);
    bVar1 = std::operator==(&filename,"TRAILER!!!");
    if (bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&filename);
    sVar3 = getFileSizeFromBigEndianHeader(&header);
    DescriptorWrapper::seek(&fd,((uint)sVar3 & 1) + sVar3,1);
    std::__cxx11::string::~string((string *)&filename);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&cFilename);
  }
  std::__cxx11::string::~string((string *)&filename);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&cFilename);
  DescriptorWrapper::~DescriptorWrapper(&fd);
  return __return_storage_ptr__;
}

Assistant:

vector<string> getFilesList(const string& cpioArchivePath) 
{
	ssize_t sz = -1;
	header_old_cpio header;
	std::vector<std::string> filenames;

	DescriptorWrapper fd = DescriptorWrapper::openFile(cpioArchivePath, O_RDONLY);

	for(;;) {
		sz = fd.readTo(&header, sizeof(header));
		if (sz == 0)
			throw CpioException(CpioException::InvalidInputArchive, "Unexpected EOF");
		if (isHeaderLittleEndian(header))
			switchEndianness(header);
		
		auto filenameSize = getFilenameSizeFromBigEndianHeader(header);
		auto realFilenameSize = filenameSize + filenameSize%2;
		auto cFilename = make_unique<char[]>(realFilenameSize);

		sz = fd.readTo(cFilename.get(), realFilenameSize);
		string filename(cFilename.get());
		if (filename == "TRAILER!!!")
			break;
		else
			filenames.push_back(filename);

		auto bytesToSkip = getFileSizeFromBigEndianHeader(header);
		auto realBytesToSkip = bytesToSkip + bytesToSkip%2;
		fd.seek((off_t)realBytesToSkip, SEEK_CUR);
	}

	return filenames;
}